

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::TestSpec::NamePattern::NamePattern(NamePattern *this,string *name,string *filterString)

{
  string local_30;
  
  Pattern::Pattern(&this->super_Pattern,filterString);
  (this->super_Pattern)._vptr_Pattern = (_func_int **)&PTR__NamePattern_002399f8;
  toLower(&local_30,name);
  WildcardPattern::WildcardPattern(&this->m_wildcardPattern,&local_30,No);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

TestSpec::NamePattern::NamePattern( std::string const& name, std::string const& filterString )
    : Pattern( filterString )
    , m_wildcardPattern( toLower( name ), CaseSensitive::No )
    {}